

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

int __thiscall
QMdiSubWindowPrivate::titleBarHeight(QMdiSubWindowPrivate *this,QStyleOptionTitleBar *options)

{
  QWidget *this_00;
  QWidget *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  QStyle *pQVar4;
  
  iVar2 = 0;
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 != 0) &&
     (this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8,
     ((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
    bVar1 = QWidget::isMaximized(this_00);
    if ((bVar1) && (bVar1 = drawTitleBarWhenMaximized(this), !bVar1)) {
      return 0;
    }
    pQVar4 = QWidget::style(this_00);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x1a,options,this_00);
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar4 = QWidget::style(this_01);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x1a,options,this_01,0);
    if (iVar3 == 0) {
      bVar1 = QWidget::isMinimized(this_00);
      iVar2 = iVar2 + (uint)bVar1 * 4 + 4;
    }
  }
  return iVar2;
}

Assistant:

int QMdiSubWindowPrivate::titleBarHeight(const QStyleOptionTitleBar &options) const
{
    Q_Q(const QMdiSubWindow);
    if (!parent || q->windowFlags() & Qt::FramelessWindowHint
        || (q->isMaximized() && !drawTitleBarWhenMaximized())) {
        return 0;
    }

    int height = q->style()->pixelMetric(QStyle::PM_TitleBarHeight, &options, q);
    if (hasBorder(options))
        height += q->isMinimized() ? 8 : 4;
    return height;
}